

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_Int32OptionValueIsNotPositiveInt_Test::
TestBody(ValidationErrorTest_Int32OptionValueIsNotPositiveInt_Test *this)

{
  allocator<char> local_41;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  string local_28;
  
  ValidationErrorTest::BuildDescriptorMessagesInTestPool(&this->super_ValidationErrorTest);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "name: \"foo.proto\" dependency: \"google/protobuf/descriptor.proto\" extension { name: \"foo\" number: 7672757 label: LABEL_OPTIONAL             type: TYPE_INT32 extendee: \"google.protobuf.FileOptions\" }options { uninterpreted_option { name { name_part: \"foo\"                                         is_extension: true }                                  string_value: \"5\" } }"
             ,&local_41);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_40,
            "foo.proto: foo.proto: OPTION_VALUE: Value must be integer, from -2147483648 to 2147483647, for int32 option \"foo\".\n"
           );
  ValidationErrorTest::BuildFileWithErrors
            (&this->super_ValidationErrorTest,&local_28,
             (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_40);
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&local_40);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, Int32OptionValueIsNotPositiveInt) {
  BuildDescriptorMessagesInTestPool();

  BuildFileWithErrors(
      "name: \"foo.proto\" "
      "dependency: \"google/protobuf/descriptor.proto\" "
      "extension { name: \"foo\" number: 7672757 label: LABEL_OPTIONAL "
      "            type: TYPE_INT32 extendee: \"google.protobuf.FileOptions\" }"
      "options { uninterpreted_option { name { name_part: \"foo\" "
      "                                        is_extension: true } "
      "                                 string_value: \"5\" } }",

      "foo.proto: foo.proto: OPTION_VALUE: Value must be integer, from "
      "-2147483648 to 2147483647, for int32 option \"foo\".\n");
}